

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O1

bool __thiscall table::insertcheck(table *this,InsertStatement *stmt)

{
  vector<char_*,_std::allocator<char_*>_> *pvVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  Expr *pEVar4;
  column *pcVar5;
  uint uVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  pointer ppcVar11;
  char *pcVar12;
  size_t sVar13;
  char *pcVar14;
  string *str2;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int j_1;
  pointer ppcVar18;
  uint __len;
  int j;
  ulong __val;
  ulong uVar19;
  column *pcVar20;
  bool bVar21;
  string __str;
  fstream os;
  char *local_260 [2];
  char local_250 [16];
  string local_240 [16];
  
  pvVar1 = stmt->columns;
  if (pvVar1 == (vector<char_*,_std::allocator<char_*>_> *)0x0) {
LAB_0011a91a:
    if ((long)(this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
              super__Vector_impl_data._M_start !=
        (long)(stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      pcVar12 = "INSERT has different number of columns than target columns";
      lVar17 = 0x3a;
LAB_0011aa13:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,lVar17);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      return false;
    }
    if (pvVar1 == (vector<char_*,_std::allocator<char_*>_> *)0x0) goto LAB_0011aaeb;
  }
  else {
    if ((long)(pvVar1->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar1->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
              super__Vector_impl_data._M_start !=
        (long)(stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      pcVar12 = "Column count doesn\'t match value count";
      lVar17 = 0x26;
      goto LAB_0011aa13;
    }
    if (pvVar1 == (vector<char_*,_std::allocator<char_*>_> *)0x0) goto LAB_0011a91a;
  }
  ppcVar18 = (pvVar1->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar2 = (pvVar1->super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  bVar21 = ppcVar18 == ppcVar2;
  if (!bVar21) {
    do {
      pcVar12 = *ppcVar18;
      std::__cxx11::string::string((string *)local_240,pcVar12,(allocator *)local_260);
      ppcVar11 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar3 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppcVar11 == ppcVar3) {
        bVar7 = true;
      }
      else {
        do {
          pcVar20 = *ppcVar11;
          bVar7 = util::compareString(&pcVar20->name,local_240);
          if (bVar7) goto LAB_0011a9aa;
          ppcVar11 = ppcVar11 + 1;
        } while (ppcVar11 != ppcVar3);
        pcVar20 = (column *)0x0;
LAB_0011a9aa:
        bVar7 = pcVar20 == (column *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240[0]._M_dataplus._M_p != &local_240[0].field_2) {
        operator_delete(local_240[0]._M_dataplus._M_p);
      }
      if (bVar7) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Unknown column ",0xf);
        if (pcVar12 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12d270);
        }
        else {
          sVar13 = strlen(pcVar12);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar12,sVar13);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout," in table list\'",0xf);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
        std::ostream::put('p');
        std::ostream::flush();
        if (!bVar21) {
          return false;
        }
        break;
      }
      ppcVar18 = ppcVar18 + 1;
      bVar21 = ppcVar18 == ppcVar2;
    } while (!bVar21);
  }
LAB_0011aaeb:
  std::fstream::fstream(local_240,(string *)&this->filename,_S_out|_S_in|_S_bin|_S_app);
  cVar8 = std::__basic_file<char>::is_open();
  if (cVar8 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"cannot open table file",0x16);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
    std::ostream::put('p');
    std::ostream::flush();
LAB_0011b062:
    bVar21 = false;
  }
  else {
    ppcVar11 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    bVar21 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
             super__Vector_impl_data._M_finish == ppcVar11;
    if (!bVar21) {
      pcVar20 = this->primaryKey;
      str2 = &pcVar20->name;
      uVar19 = 0;
      do {
        iVar9 = std::__cxx11::string::compare((char *)&ppcVar11[uVar19]->flag);
        if (iVar9 == 0) {
          pEVar4 = (stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar19];
          if (pEVar4->type == kExprLiteralString) {
            pcVar12 = pEVar4->name;
            sVar13 = strlen(pcVar12);
            pcVar5 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar19];
            if ((ulong)(long)pcVar5->element_truesize < sVar13) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Wrong Char size",0xf);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
              std::ostream::put('p');
              std::ostream::flush();
              goto LAB_0011b062;
            }
            if ((pcVar20 != (column *)0x0) &&
               (bVar21 = util::compareString(&pcVar5->name,str2), bVar21)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"check primary key values",0x18);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
              std::ostream::put('p');
              std::ostream::flush();
              if (0 < this->rowlength) {
                iVar9 = 0;
                do {
                  std::istream::seekg(local_240,
                                      (long)(this->table_cols).
                                            super__Vector_base<column_*,_std::allocator<column_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start[uVar19]->
                                            col_offset + (long)iVar9 * (long)this->rowSize,0);
                  iVar10 = (this->table_cols).
                           super__Vector_base<column_*,_std::allocator<column_*>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar19]->element_truesize;
                  if (iVar10 < 0) {
                    iVar10 = -1;
                  }
                  pcVar14 = (char *)operator_new__((long)iVar10);
                  std::istream::read((char *)local_240,(long)pcVar14);
                  bVar21 = util::compareString(pcVar14,pcVar12);
                  if (bVar21) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "Can\'t insert duplicate values to primary key column",0x33);
                    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                    std::ostream::put('p');
                    std::ostream::flush();
                    operator_delete(pcVar14);
                    if (bVar21) goto LAB_0011b062;
                  }
                  iVar9 = iVar9 + 1;
                } while (iVar9 < this->rowlength);
              }
            }
          }
          else {
            uVar16 = (stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>)
                     ._M_impl.super__Vector_impl_data._M_start[uVar19]->ival;
            __val = -uVar16;
            if (0 < (long)uVar16) {
              __val = uVar16;
            }
            __len = 1;
            if (9 < __val) {
              uVar15 = __val;
              uVar6 = 4;
              do {
                __len = uVar6;
                if (uVar15 < 100) {
                  __len = __len - 2;
                  goto LAB_0011ae8b;
                }
                if (uVar15 < 1000) {
                  __len = __len - 1;
                  goto LAB_0011ae8b;
                }
                if (uVar15 < 10000) goto LAB_0011ae8b;
                bVar21 = 99999 < uVar15;
                uVar15 = uVar15 / 10000;
                uVar6 = __len + 4;
              } while (bVar21);
              __len = __len + 1;
            }
LAB_0011ae8b:
            local_260[0] = local_250;
            std::__cxx11::string::_M_construct
                      ((ulong)local_260,(char)__len - (char)((long)uVar16 >> 0x3f));
            std::__detail::__to_chars_10_impl<unsigned_long>
                      (local_260[0] + -((long)uVar16 >> 0x3f),__len,__val);
            pcVar12 = local_260[0];
            if (local_260[0] != local_250) {
              operator_delete(local_260[0]);
            }
            sVar13 = strlen(pcVar12);
            pcVar5 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar19];
            if ((ulong)(long)pcVar5->element_truesize < sVar13) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Wrong Char size",0xf);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
              std::ostream::put('p');
              std::ostream::flush();
              goto LAB_0011b062;
            }
            if ((pcVar20 != (column *)0x0) &&
               (bVar21 = util::compareString(&pcVar5->name,str2), bVar21 && 0 < this->rowlength)) {
              iVar9 = 0;
              do {
                std::istream::seekg(local_240,
                                    (long)(this->table_cols).
                                          super__Vector_base<column_*,_std::allocator<column_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start[uVar19]->
                                          col_offset + (long)iVar9 * (long)this->rowSize,0);
                iVar10 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar19]->element_truesize;
                if (iVar10 < 0) {
                  iVar10 = -1;
                }
                pcVar14 = (char *)operator_new__((long)iVar10);
                std::istream::read((char *)local_240,(long)pcVar14);
                bVar21 = util::compareString(pcVar14,pcVar12);
                if (bVar21) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "Can\'t insert duplicate values to primary key column",0x33);
                  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                  std::ostream::put('p');
                  std::ostream::flush();
                  operator_delete(pcVar14);
                  if (bVar21) goto LAB_0011b062;
                }
                iVar9 = iVar9 + 1;
              } while (iVar9 < this->rowlength);
            }
          }
        }
        else {
          if ((stmt->values->super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>).
              _M_impl.super__Vector_impl_data._M_start[uVar19]->type == kExprLiteralString) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"need a int value instead of a string",0x24);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
            std::ostream::put('p');
            std::ostream::flush();
            goto LAB_0011b062;
          }
          if ((pcVar20 != (column *)0x0) &&
             (bVar21 = util::compareString(&(this->table_cols).
                                            super__Vector_base<column_*,_std::allocator<column_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start[uVar19]->name,
                                           str2), bVar21 && 0 < this->rowlength)) {
            iVar9 = 0;
            do {
              std::istream::seekg(local_240,
                                  (long)(this->table_cols).
                                        super__Vector_base<column_*,_std::allocator<column_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start[uVar19]->col_offset
                                  + (long)iVar9 * (long)this->rowSize,0);
              iVar10 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar19]->element_truesize;
              if (iVar10 < 0) {
                iVar10 = -1;
              }
              pcVar12 = (char *)operator_new__((long)iVar10);
              std::istream::read((char *)local_240,(long)pcVar12);
              bVar21 = util::compareString(pcVar12,(char *)&(stmt->values->
                                                                                                                        
                                                  super__Vector_base<hsql::Expr_*,_std::allocator<hsql::Expr_*>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[uVar19]
                                                  ->ival);
              if (bVar21) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "Can\'t insert duplicate values to primary key column",0x33);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                std::ostream::put('p');
                std::ostream::flush();
                operator_delete(pcVar12);
                if (bVar21) goto LAB_0011b062;
              }
              iVar9 = iVar9 + 1;
            } while (iVar9 < this->rowlength);
          }
        }
        uVar19 = uVar19 + 1;
        ppcVar11 = (this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        uVar16 = (long)(this->table_cols).super__Vector_base<column_*,_std::allocator<column_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar11 >> 3;
        bVar21 = uVar16 <= uVar19;
      } while (uVar19 < uVar16);
    }
    std::fstream::close();
  }
  std::fstream::~fstream(local_240);
  return bVar21;
}

Assistant:

bool table::insertcheck(hsql::InsertStatement *stmt) {

    if(stmt->columns != NULL && stmt->columns->size() != stmt->values->size()){
        cout <<"Column count doesn't match value count"<<endl;
        return false;
    }
    if(stmt->columns == NULL && table_cols.size() != stmt->values->size()){
        cout <<"INSERT has different number of columns than target columns"<<endl;
        return false;
    }
    if(stmt->columns != NULL){
        for(char* col_name : *stmt->columns){
            auto it = getColumn(col_name);
            if(it == NULL){
                cout <<"Unknown column "<<col_name<<" in table list'"<<endl;
                return false;
            }
        }
    }
    fstream os(filename, ios::in|ios::out|ios::binary|ios::app);
    if(!os.is_open()){
        cout << "cannot open table file" <<endl;
        return false;
    }

    //check insert type
    column* primary = getPrimaryKey();
    for(int i=0; i < table_cols.size(); i++){

        if(table_cols[i]->flag == "CHAR"){
            if((*stmt->values)[i]->type == hsql::kExprLiteralString){
                const char* str = (*stmt->values)[i]->name ;
                if( strlen(str) > table_cols[i]->element_truesize ){
                    cout << "Wrong Char size" << endl;
                    return false;
                }
                if(primary != nullptr && util::compareString(table_cols[i]->name, primary->name)){
                    cout << "check primary key values"<<endl;
                    for(int j=0 ; j < getRowlength(); j++){
                        os.seekg(j * rowSize + table_cols[i]->col_offset);
                        char *bytes = new char[table_cols[i]->element_truesize];
                        os.read(bytes, table_cols[i]->element_truesize);
                        if(util::compareString(bytes, str)){
                            cout<<"Can't insert duplicate values to primary key column"<<endl;
                            delete bytes;
                            return false;
                        }

                    }
                }

            }
            else{
                const char* str = to_string( (*stmt->values)[i]->ival ).c_str();
                if( strlen(str) > table_cols[i]->element_truesize ){
                    cout << "Wrong Char size" << endl;
                    return false;
                }
                if(primary!=nullptr&&util::compareString(table_cols[i]->name, primary->name)){
                    for(int j=0 ; j < getRowlength(); j++){
                        os.seekg(j * rowSize + table_cols[i]->col_offset);
                        char *bytes = new char[table_cols[i]->element_truesize];
                        os.read(bytes, table_cols[i]->element_truesize);
                        if(util::compareString(bytes, str)){
                            cout<<"Can't insert duplicate values to primary key column"<<endl;
                            delete bytes;
                            return false;
                        }
                    }
                }
            }
        }
        else{
            if((*stmt->values)[i]->type == hsql::kExprLiteralString){
                cout<<"need a int value instead of a string"<<endl;
                return false;
            }
            if(primary!= nullptr && util::compareString(table_cols[i]->name, primary->name)){
                for(int j=0 ; j < getRowlength(); j++){
                    os.seekg(j * rowSize + table_cols[i]->col_offset);
                    char *bytes = new char[table_cols[i]->element_truesize];
                    os.read(bytes, table_cols[i]->element_truesize);
                    //cout  << bytes <<endl;
                    if(util::compareString(bytes, (char*)&(*stmt->values)[i]->ival)){
                        cout<<"Can't insert duplicate values to primary key column"<<endl;
                        delete bytes;
                        return false;
                    }

                }
            }

        }
    }
    os.close();

    return true;
}